

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O2

Move * ddLinearAndSiftingDown(DdManager *table,int x,int xHigh,Move *prevMoves)

{
  int x_00;
  int iVar1;
  int iVar2;
  DdHalfWord y;
  int iVar3;
  uint uVar4;
  DdHalfWord DVar5;
  DdNode *pDVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint local_50;
  DdNode *local_40;
  
  x_00 = table->invperm[x];
  uVar9 = table->keys;
  iVar1 = table->isolated;
  lVar7 = (long)xHigh;
  lVar10 = lVar7 * 0xe + 4;
  iVar8 = 0;
  for (; x < lVar7; lVar7 = lVar7 + -1) {
    iVar3 = table->invperm[lVar7];
    iVar2 = cuddTestInteract(table,x_00,iVar3);
    if (iVar2 != 0) {
      iVar8 = (iVar8 - (uint)(table->vars[iVar3]->ref == 1)) +
              *(int *)((long)&table->subtables->nodelist + lVar10 * 4);
    }
    lVar10 = lVar10 + -0xe;
  }
  uVar9 = uVar9 - iVar1;
  y = cuddNextHigh(table,x);
  local_50 = uVar9;
  local_40 = (DdNode *)prevMoves;
  while( true ) {
    if (xHigh < (int)y) {
      return (Move *)local_40;
    }
    if ((int)local_50 <= (int)(uVar9 - iVar8)) {
      return (Move *)local_40;
    }
    iVar1 = table->invperm[(int)y];
    iVar3 = cuddTestInteract(table,x_00,iVar1);
    if (iVar3 != 0) {
      iVar8 = (iVar8 + (uint)(table->vars[iVar1]->ref == 1)) - table->subtables[(int)y].keys;
    }
    uVar9 = cuddSwapInPlace(table,x,y);
    if (((uVar9 == 0) || (uVar4 = cuddLinearInPlace(table,x,y), uVar4 == 0)) ||
       (pDVar6 = cuddDynamicAllocNode(table), pDVar6 == (DdNode *)0x0)) break;
    pDVar6->index = x;
    pDVar6->ref = y;
    (pDVar6->type).kids.T = local_40;
    *(undefined4 *)&pDVar6->next = 0;
    local_40 = pDVar6;
    if ((int)uVar4 < (int)uVar9) {
      iVar3 = cuddTestInteract(table,x_00,iVar1);
      if (iVar3 != 0) {
        *(undefined4 *)&pDVar6->next = 1;
        cuddUpdateInteractionMatrix(table,x_00,iVar1);
        uVar9 = uVar4;
      }
    }
    else {
      uVar4 = cuddLinearInPlace(table,x,y);
      if (uVar4 == 0) break;
      if (uVar4 != uVar9) {
        fprintf((FILE *)table->out,"Change in size after identity transformation! From %d to %d\n",
                (ulong)uVar9,(ulong)uVar4);
      }
    }
    *(uint *)((long)&pDVar6->next + 4) = uVar9;
    if ((double)(int)local_50 * table->maxGrowth < (double)(int)uVar9) {
      return (Move *)pDVar6;
    }
    if ((int)uVar9 < (int)local_50) {
      local_50 = uVar9;
    }
    DVar5 = cuddNextHigh(table,y);
    x = y;
    y = DVar5;
  }
  while (local_40 != (DdNode *)0x0) {
    pDVar6 = (local_40->type).kids.T;
    local_40->ref = 0;
    local_40->next = table->nextFree;
    table->nextFree = local_40;
    local_40 = pDVar6;
  }
  return (Move *)0xffffffffffffffff;
}

Assistant:

static Move *
ddLinearAndSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh,
  Move * prevMoves)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size, newsize;
    int         R;      /* upper bound on node decrease */
    int         limitSize;
    int         xindex, yindex;
    int         isolated;
#ifdef DD_DEBUG
    int         checkR;
    int         z;
    int         zindex;
#endif

    moves = prevMoves;
    /* Initialize R */
    xindex = table->invperm[x];
    limitSize = size = table->keys - table->isolated;
    R = 0;
    for (y = xHigh; y > x; y--) {
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[yindex]->ref == 1;
            R += table->subtables[y].keys - isolated;
        }
    }

    y = cuddNextHigh(table,x);
    while (y <= xHigh && size - R < limitSize) {
#ifdef DD_DEBUG
        checkR = 0;
        for (z = xHigh; z > x; z--) {
            zindex = table->invperm[z];
            if (cuddTestInteract(table,xindex,zindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkR += table->subtables[z].keys - isolated;
            }
        }
        if (R != checkR) {
            (void) fprintf(table->out, "checkR(%d) != R(%d)\n",checkR,R);
        }
#endif
        /* Update upper bound on node decrease. */
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[yindex]->ref == 1;
            R -= table->subtables[y].keys - isolated;
        }
        size = cuddSwapInPlace(table,x,y);
        if (size == 0) goto ddLinearAndSiftingDownOutOfMem;
        newsize = cuddLinearInPlace(table,x,y);
        if (newsize == 0) goto ddLinearAndSiftingDownOutOfMem;
        move = (Move *) cuddDynamicAllocNode(table);
        if (move == NULL) goto ddLinearAndSiftingDownOutOfMem;
        move->x = x;
        move->y = y;
        move->next = moves;
        moves = move;
        move->flags = CUDD_SWAP_MOVE;
        if (newsize >= size) {
            /* Undo transformation. The transformation we apply is
            ** its own inverse. Hence, we just apply the transformation
            ** again.
            */
            newsize = cuddLinearInPlace(table,x,y);
            if (newsize == 0) goto ddLinearAndSiftingDownOutOfMem;
            if (newsize != size) {
                (void) fprintf(table->out,"Change in size after identity transformation! From %d to %d\n",size,newsize);
            }
        } else if (cuddTestInteract(table,xindex,yindex)) {
            size = newsize;
            move->flags = CUDD_LINEAR_TRANSFORM_MOVE;
            cuddUpdateInteractionMatrix(table,xindex,yindex);
        }
        move->size = size;
        if ((double) size > (double) limitSize * table->maxGrowth) break;
        if (size < limitSize) limitSize = size;
        x = y;
        y = cuddNextHigh(table,x);
    }
    return(moves);

ddLinearAndSiftingDownOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}